

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int base64_decode(uchar *input,uchar *output)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  
  bVar1 = *input;
  if (bVar1 == 0) {
    return 0;
  }
  if (output == (uchar *)0x0) {
    output = input;
  }
  pbVar7 = input + 4;
  uVar6 = 0;
  do {
    if (char_to_num[bVar1] == -1) {
      return -1;
    }
    cVar2 = char_to_num[pbVar7[-3]];
    if (cVar2 == -1) {
      return -1;
    }
    bVar3 = pbVar7[-2];
    uVar9 = (ulong)bVar3;
    if ((uVar9 != 0x3d) && (char_to_num[uVar9] == -1)) {
      return -1;
    }
    bVar4 = pbVar7[-1];
    uVar8 = (ulong)bVar4;
    if ((uVar8 != 0x3d) && (char_to_num[uVar8] == -1)) {
      return -1;
    }
    output[uVar6] = cVar2 >> 4 | char_to_num[bVar1] << 2;
    if (bVar3 == 0x3d) {
      uVar6 = (ulong)((int)uVar6 + 1);
      break;
    }
    cVar5 = char_to_num[uVar9];
    output[uVar6 + 1] = cVar5 >> 2 | cVar2 << 4;
    if (bVar4 == 0x3d) {
      uVar6 = (ulong)((int)uVar6 + 2);
      break;
    }
    output[uVar6 + 2] = cVar5 << 6 | char_to_num[uVar8];
    bVar1 = *pbVar7;
    pbVar7 = pbVar7 + 4;
    uVar6 = uVar6 + 3;
  } while (bVar1 != 0);
  return (int)uVar6;
}

Assistant:

static int 
base64_decode(unsigned char *input, unsigned char *output)
{
    int len = 0;
    int c1, c2, c3, c4;

    if (output == NULL) output = input;
    while (*input) {
	c1 = *input++;
	if (char_to_num[c1] == -1) return -1;
	c2 = *input++;
	if (char_to_num[c2] == -1) return -1;
	c3 = *input++;
	if (c3 != '=' && char_to_num[c3] == -1) return -1; 
	c4 = *input++;
	if (c4 != '=' && char_to_num[c4] == -1) return -1;
	*output++ = (char_to_num[c1] << 2) | (char_to_num[c2] >> 4);
	++len;
	if (c3 == '=') break;
	*output++ = ((char_to_num[c2] << 4) & 0xf0) | (char_to_num[c3] >> 2);
	++len;
	if (c4 == '=') break;
	*output++ = ((char_to_num[c3] << 6) & 0xc0) | char_to_num[c4];
	++len;
    }

    return len;
}